

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

Gia_Man_t * Gia_ManRehash(Gia_Man_t *p,int fAddStrash)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p_00->fAddStrash = fAddStrash;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  if (0 < p->nObjs) {
    lVar14 = 8;
    lVar13 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar14 + -8);
      uVar15 = (uint)uVar4;
      iVar6 = (int)(uVar4 & 0x1fffffff);
      if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar15 < 0) {
        if ((uVar15 & 0x9fffffff) == 0x9fffffff) {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_0020ab90:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_0020ab90;
          iVar6 = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
          goto LAB_0020ab37;
        }
        if ((int)uVar15 < 0 && iVar6 != 0x1fffffff) {
          uVar1 = *(uint *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar6 << 2) * -3);
          if ((int)uVar1 < 0) goto LAB_0020abaf;
          uVar16 = uVar1 >> 1;
          if (p_00->nObjs <= (int)uVar16) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p_00->pObjs + uVar16) & 0x1fffffff) != 0 &&
              (int)*(uint *)(p_00->pObjs + uVar16) < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar4 | 0x80000000;
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_0020ab90;
          uVar11 = (ulong)(((uint)((int)pGVar9 - (int)pGVar5) >> 2) * -0x55555555 - uVar16 &
                          0x1fffffff);
          uVar12 = (ulong)((uVar1 << 0x1d ^ uVar15) & 0x20000000);
          *(ulong *)pGVar9 = uVar12 | uVar4 & 0xffffffffc0000000 | 0x80000000 | uVar11;
          *(ulong *)pGVar9 =
               uVar12 | uVar4 & 0xe0000000c0000000 | 0x80000000 | uVar11 |
               (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_0020ab90;
          Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
          if (p_00->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_00,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9
                            );
          }
          pGVar5 = p_00->pObjs;
          if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_0020ab90;
          iVar6 = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
          goto LAB_0020ab37;
        }
      }
      else {
        uVar15 = *(uint *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar6 << 2) * -3);
        if (((int)uVar15 < 0) ||
           (uVar1 = *(uint *)((long)pGVar3 +
                             lVar14 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) {
LAB_0020abaf:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar6 = Gia_ManHashAnd(p_00,uVar15 ^ (uint)(uVar4 >> 0x1d) & 1,
                               uVar1 ^ (uint)(uVar4 >> 0x3d) & 1);
LAB_0020ab37:
        *(int *)(&pGVar3->field_0x0 + lVar14) = iVar6;
      }
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar13 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  p_00->fAddStrash = 0;
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManRehash( Gia_Man_t * p, int fAddStrash )  
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->fAddStrash = fAddStrash;
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        //if ( Gia_ObjIsBuf(pObj) )
        //    pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        //else 
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    pNew->fAddStrash = 0;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
//    printf( "Top gate is %s\n", Gia_ObjFaninC0(Gia_ManCo(pNew, 0))? "OR" : "AND" );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}